

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O1

void CP_ReaderCloseHandler
               (CManager cm,CMConnection conn,void *Msg_v,void *client_data,attr_list attrs)

{
  WS_ReaderInfo CP_WSR_Stream;
  SstStream s;
  void *__ptr;
  
  if (_perfstubs_initialized == 1) {
    if (CP_ReaderCloseHandler::timer == (void *)0x0) {
      __ptr = (void *)ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/sst/cp/cp_writer.c"
                                          ,"CP_ReaderCloseHandler",0x972);
      CP_ReaderCloseHandler::timer = (void *)ps_timer_create_(__ptr);
      free(__ptr);
    }
    ps_timer_start_(CP_ReaderCloseHandler::timer);
  }
  CP_WSR_Stream = *Msg_v;
  pthread_mutex_lock((pthread_mutex_t *)&CP_WSR_Stream->ParentStream->DataLock);
  s = CP_WSR_Stream->ParentStream;
  if ((s != (SstStream)0x0) && (s->Status == Established)) {
    CP_verbose(s,PerStepVerbose,
               "Reader Close message received for stream %p.  Setting state to PeerClosed and releasing timesteps.\n"
               ,CP_WSR_Stream);
    CP_PeerFailCloseWSReader(CP_WSR_Stream,PeerClosed);
    pthread_mutex_unlock((pthread_mutex_t *)&CP_WSR_Stream->ParentStream->DataLock);
    if (_perfstubs_initialized == 1) {
      ps_timer_stop_(CP_ReaderCloseHandler::timer);
      return;
    }
    return;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&s->DataLock);
  return;
}

Assistant:

void CP_ReaderCloseHandler(CManager cm, CMConnection conn, void *Msg_v, void *client_data,
                           attr_list attrs)
{
    PERFSTUBS_TIMER_START_FUNC(timer);
    struct _ReaderCloseMsg *Msg = (struct _ReaderCloseMsg *)Msg_v;

    WS_ReaderInfo CP_WSR_Stream = Msg->WSR_Stream;
    STREAM_MUTEX_LOCK(CP_WSR_Stream->ParentStream);
    if ((CP_WSR_Stream->ParentStream == NULL) ||
        (CP_WSR_Stream->ParentStream->Status != Established))
    {
        STREAM_MUTEX_UNLOCK(CP_WSR_Stream->ParentStream);
        return;
    }

    CP_verbose(CP_WSR_Stream->ParentStream, PerStepVerbose,
               "Reader Close message received for stream %p.  Setting state to "
               "PeerClosed and releasing timesteps.\n",
               CP_WSR_Stream);
    CP_PeerFailCloseWSReader(CP_WSR_Stream, PeerClosed);
    STREAM_MUTEX_UNLOCK(CP_WSR_Stream->ParentStream);
    PERFSTUBS_TIMER_STOP_FUNC(timer);
}